

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

void __thiscall
spvtools::opt::Function::ForEachParam
          (Function *this,function<void_(spvtools::opt::Instruction_*)> *f,
          bool run_on_debug_line_insts)

{
  pointer puVar1;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> *param;
  pointer puVar2;
  
  puVar1 = (this->params_).
           super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (this->params_).
                super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    Instruction::ForEachInst
              ((puVar2->_M_t).
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,f,
               run_on_debug_line_insts);
  }
  return;
}

Assistant:

void Function::ForEachParam(const std::function<void(Instruction*)>& f,
                            bool run_on_debug_line_insts) {
  for (auto& param : params_)
    static_cast<Instruction*>(param.get())
        ->ForEachInst(f, run_on_debug_line_insts);
}